

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_pslldq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = s->_l_ZMMReg[0];
  uVar2 = 0x10;
  if ((int)uVar1 < 0x10) {
    lVar3 = 0x10;
    do {
      d->_b_ZMMReg[lVar3 + -1] = d->_b_ZMMReg[lVar3 + (-1 - (long)(int)uVar1)];
      lVar3 = lVar3 + -1;
      uVar2 = uVar1;
    } while ((int)uVar1 < lVar3);
  }
  if ((int)uVar1 < 1) {
    return;
  }
  memset(d,0,(ulong)uVar2);
  return;
}

Assistant:

void glue(helper_pslldq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift, i;

    shift = s->L(0);
    if (shift > 16) {
        shift = 16;
    }
    for (i = 15; i >= shift; i--) {
        d->B(i) = d->B(i - shift);
    }
    for (i = 0; i < shift; i++) {
        d->B(i) = 0;
    }
}